

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_model_read_classdef(ngram_model_t *model,char *file_name)

{
  undefined8 *puVar1;
  gnode_s *pgVar2;
  int32 iVar3;
  hash_table_t *classes_00;
  glist_t g;
  hash_entry_t *he_1;
  classdef_t *classdef;
  hash_entry_t *he;
  gnode_s *pgStack_38;
  int32 rv;
  gnode_t *gn;
  glist_t hl;
  hash_table_t *classes;
  char *file_name_local;
  ngram_model_t *model_local;
  
  he._4_4_ = -1;
  classes_00 = hash_table_new(0,0);
  iVar3 = read_classdef_file(classes_00,file_name);
  if (iVar3 < 0) {
    hash_table_free(classes_00);
    model_local._4_4_ = -1;
  }
  else {
    g = hash_table_tolist(classes_00,(int32 *)0x0);
    for (pgStack_38 = g; pgVar2 = g, pgStack_38 != (glist_t)0x0; pgStack_38 = pgStack_38->next) {
      puVar1 = *(undefined8 **)((long)(pgStack_38->data).ptr + 0x10);
      iVar3 = ngram_model_add_class
                        (model,*(pgStack_38->data).ptr,1.0,(char **)*puVar1,(float32 *)puVar1[1],
                         *(int32 *)(puVar1 + 2));
      if (iVar3 < 0) goto LAB_00106fbf;
    }
    he._4_4_ = 0;
LAB_00106fbf:
    while (pgStack_38 = pgVar2, pgStack_38 != (glist_t)0x0) {
      puVar1 = (undefined8 *)(pgStack_38->data).ptr;
      ckd_free((void *)*puVar1);
      classdef_free((classdef_t *)puVar1[2]);
      pgVar2 = pgStack_38->next;
    }
    glist_free(g);
    hash_table_free(classes_00);
    model_local._4_4_ = he._4_4_;
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_model_read_classdef(ngram_model_t * model, const char *file_name)
{
    hash_table_t *classes;
    glist_t hl = NULL;
    gnode_t *gn;
    int32 rv = -1;

    classes = hash_table_new(0, FALSE);
    if (read_classdef_file(classes, file_name) < 0) {
        hash_table_free(classes);
        return -1;
    }

    /* Create a new class in the language model for each classdef. */
    hl = hash_table_tolist(classes, NULL);
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        classdef_t *classdef = he->val;

        if (ngram_model_add_class(model, he->key, 1.0,
                                  classdef->words,
                                  classdef->weights,
                                  classdef->n_words) < 0)
            goto error_out;
    }
    rv = 0;

  error_out:
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        ckd_free((char *) he->key);
        classdef_free(he->val);
    }
    glist_free(hl);
    hash_table_free(classes);
    return rv;
}